

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void dumpProfileFab(FArrayBox *fab,string *file)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  bool bVar7;
  ostream *poVar8;
  Long LVar9;
  int iVar10;
  int n;
  long lVar11;
  int iVar12;
  int local_260;
  Box local_25c;
  double local_240;
  Box *local_238;
  ofstream osf;
  ostream local_220 [496];
  
  local_25c.smallend.vect[2] = (fab->super_BaseFab<double>).domain.smallend.vect[2];
  local_25c.smallend.vect[0] =
       (int)((double)((fab->super_BaseFab<double>).domain.bigend.vect[0] +
                     (fab->super_BaseFab<double>).domain.smallend.vect[0]) * 0.5);
  local_25c.bigend.vect[2] = (fab->super_BaseFab<double>).domain.bigend.vect[2];
  local_25c.smallend.vect[1] = 0x73;
  local_25c.bigend.vect[1] = 0x7d;
  local_25c.btype.itype = 0;
  local_25c.bigend.vect[0] = local_25c.smallend.vect[0];
  poVar8 = amrex::OutStream();
  amrex::Print::Print((Print *)&osf,poVar8);
  std::operator<<(local_220,"dumping over ");
  amrex::operator<<(local_220,&local_25c);
  std::operator<<(local_220,'\n');
  local_238 = &(fab->super_BaseFab<double>).domain;
  amrex::Print::~Print((Print *)&osf);
  std::ofstream::ofstream(&osf,(file->_M_dataplus)._M_p,_S_out);
  local_260 = local_25c.smallend.vect[2];
  iVar10 = local_25c.smallend.vect[1];
  do {
    local_240 = ((double)iVar10 + 0.5) * 3.5 * 0.00390625;
    iVar12 = local_25c.smallend.vect[0];
    do {
      if ((local_25c.bigend.vect[2] < local_260) ||
         ((local_25c.bigend.vect[2] == local_260 &&
          ((local_25c.bigend.vect[1] < iVar10 ||
           ((local_25c.bigend.vect[1] == iVar10 && (local_25c.bigend.vect[0] < iVar12)))))))) {
        amrex::Abort_host((char *)0x0);
        std::ofstream::~ofstream(&osf);
        return;
      }
      poVar8 = (ostream *)std::ostream::operator<<(&osf,iVar10);
      std::operator<<(poVar8," ");
      poVar8 = std::ostream::_M_insert<double>(local_240);
      std::operator<<(poVar8," ");
      for (lVar11 = 0; lVar11 < (fab->super_BaseFab<double>).nvar; lVar11 = lVar11 + 1) {
        iVar1 = (fab->super_BaseFab<double>).domain.smallend.vect[0];
        iVar2 = (fab->super_BaseFab<double>).domain.smallend.vect[1];
        iVar3 = (fab->super_BaseFab<double>).domain.bigend.vect[0];
        iVar4 = (fab->super_BaseFab<double>).domain.smallend.vect[2];
        iVar5 = (fab->super_BaseFab<double>).domain.bigend.vect[1];
        pdVar6 = (fab->super_BaseFab<double>).dptr;
        LVar9 = amrex::Box::numPts(local_238);
        poVar8 = std::ostream::_M_insert<double>
                           (pdVar6[(long)(iVar12 - iVar1) +
                                   (long)((((iVar5 - iVar2) + 1) * (local_260 - iVar4) +
                                          (iVar10 - iVar2)) * ((iVar3 - iVar1) + 1)) +
                                   LVar9 * lVar11]);
        std::operator<<(poVar8," ");
      }
      std::operator<<((ostream *)&osf,'\n');
      bVar7 = iVar12 < local_25c.bigend.vect[0];
      iVar12 = iVar12 + 1;
    } while (bVar7);
    bVar7 = local_25c.bigend.vect[1] <= iVar10;
    iVar10 = iVar10 + 1;
    if (bVar7) {
      local_260 = local_260 + 1;
      iVar10 = local_25c.smallend.vect[1];
    }
  } while( true );
}

Assistant:

void dumpProfileFab(const FArrayBox& fab,
                    const std::string& file)
{
  const Box& box = fab.box();
  int imid = (int)(0.5*(box.smallEnd()[0] + box.bigEnd()[0]));
  IntVect iv1 = box.smallEnd(); iv1[0] = imid;
  IntVect iv2 = box.bigEnd(); iv2[0] = imid;
  iv1[1] = 115; iv2[1]=125;
  Box pb(iv1,iv2);
  amrex::Print() << "dumping over " << pb << '\n';

  std::ofstream osf(file.c_str());
  for (IntVect iv = pb.smallEnd(); iv <= pb.bigEnd(); pb.next(iv))
  {
    osf << iv[1] << " " << (iv[1]+0.5)*3.5/256 << " ";
    for (int n=0; n<fab.nComp(); ++n)
      osf << fab(iv,n) << " ";
    osf << '\n';
  }
  amrex::Abort();
}